

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
write_double_sprintf<long_double>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,longdouble value,format_specs *spec,basic_buffer<wchar_t> *buffer)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  char_type format [10];
  wchar_t local_58;
  undefined1 local_54 [8];
  undefined4 local_4c [7];
  
  if (buffer->capacity_ == 0) {
    __assert_fail("(buffer.capacity() != 0) && \"empty buffer\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fireice-uk[P]gulps/./fmt/format.h"
                  ,0xba7,
                  "void fmt::basic_writer<fmt::back_insert_range<fmt::internal::basic_buffer<wchar_t>>>::write_double_sprintf(T, const format_specs &, internal::basic_buffer<char_type> &) [Range = fmt::back_insert_range<fmt::internal::basic_buffer<wchar_t>>, T = long double]"
                 );
  }
  local_58 = L'%';
  if ((spec->flags_ & 8) == 0) {
    puVar4 = (undefined8 *)local_54;
  }
  else {
    puVar4 = (undefined8 *)(local_54 + 4);
    local_54._0_4_ = 0x23;
  }
  if (-1 < spec->precision_) {
    *puVar4 = 0x2a0000002e;
    puVar4 = puVar4 + 1;
  }
  *(undefined4 *)puVar4 = 0x4c;
  *(wchar_t *)((long)puVar4 + 4) = spec->type_;
  *(undefined4 *)(puVar4 + 1) = 0;
  do {
    uVar3 = internal::char_traits<wchar_t>::format_float<long_double>
                      (buffer->ptr_,buffer->capacity_,&local_58,spec->precision_,value);
    if ((int)uVar3 < 0) {
      if (buffer->capacity_ != 0xffffffffffffffff) {
        (**buffer->_vptr_basic_buffer)(buffer,buffer->capacity_ + 1);
      }
LAB_00134890:
      bVar2 = false;
    }
    else {
      uVar5 = (ulong)uVar3;
      uVar1 = buffer->capacity_;
      if (uVar5 < uVar1) {
        buffer->size_ = uVar5;
        bVar2 = true;
      }
      else {
        bVar2 = false;
        if (uVar1 < uVar3 + 1) {
          (**buffer->_vptr_basic_buffer)(buffer,(ulong)(uVar3 + 1));
        }
      }
      if (uVar1 <= uVar5) goto LAB_00134890;
    }
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void basic_writer<Range>::write_double_sprintf(
    T value, const format_specs &spec,
    internal::basic_buffer<char_type>& buffer) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buffer.capacity() != 0, "empty buffer");

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  char_type format[MAX_FORMAT_SIZE];
  char_type *format_ptr = format;
  *format_ptr++ = '%';
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = spec.type();
  *format_ptr = '\0';

  // Format using snprintf.
  char_type *start = FMT_NULL;
  for (;;) {
    std::size_t buffer_size = buffer.capacity();
    start = &buffer[0];
    int result = internal::char_traits<char_type>::format_float(
        start, buffer_size, format, spec.precision(), value);
    if (result >= 0) {
      unsigned n = internal::to_unsigned(result);
      if (n < buffer.capacity()) {
        buffer.resize(n);
        break;  // The buffer is large enough - continue with formatting.
      }
      buffer.reserve(n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer.reserve(buffer.capacity() + 1);
    }
  }
}